

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_expansion.cc
# Opt level: O2

bool __thiscall sptk::MuLawExpansion::Run(MuLawExpansion *this,double input,double *output)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  
  bVar3 = (bool)(output != (double *)0x0 & this->is_valid_);
  if (bVar3 == true) {
    dVar4 = this->abs_max_value_;
    dVar1 = this->constant_;
    iVar2 = ExtractSign(input);
    dVar4 = pow(this->compression_factor_ + 1.0,ABS(input) / dVar4);
    *output = (dVar4 + -1.0) * (double)iVar2 * dVar1;
  }
  return bVar3;
}

Assistant:

bool MuLawExpansion::Run(double input, double* output) const {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  const double x(std::fabs(input) / abs_max_value_);
  *output = (constant_ * sptk::ExtractSign(input) *
             (std::pow(1.0 + compression_factor_, x) - 1.0));

  return true;
}